

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock.h
# Opt level: O2

void __thiscall
testing::internal::FunctionMockerBase<BasicTestExpr<1>_(TestPLTermBuilder,_BasicTestExpr<1>)>::
FunctionMockerBase(FunctionMockerBase<BasicTestExpr<1>_(TestPLTermBuilder,_BasicTestExpr<1>)> *this)

{
  UntypedFunctionMockerBase::UntypedFunctionMockerBase(&this->super_UntypedFunctionMockerBase);
  (this->super_UntypedFunctionMockerBase)._vptr_UntypedFunctionMockerBase =
       (_func_int **)&PTR__FunctionMockerBase_002b6c10;
  (this->current_spec_).function_mocker_ = this;
  ((linked_ptr<const_testing::MatcherInterface<BasicTestExpr<1>_>_> *)
  ((long)&(this->current_spec_).matchers_.
          super__Tuple_impl<0UL,_testing::Matcher<TestPLTermBuilder>,_testing::Matcher<BasicTestExpr<1>_>_>
          .super__Tuple_impl<1UL,_testing::Matcher<BasicTestExpr<1>_>_>.
          super__Head_base<1UL,_testing::Matcher<BasicTestExpr<1>_>,_false>._M_head_impl.
          super_MatcherBase<BasicTestExpr<1>_> + 8))->value_ =
       (MatcherInterface<BasicTestExpr<1>_> *)0x0;
  ((linked_ptr_internal *)
  ((long)&(this->current_spec_).matchers_.
          super__Tuple_impl<0UL,_testing::Matcher<TestPLTermBuilder>,_testing::Matcher<BasicTestExpr<1>_>_>
          .super__Tuple_impl<1UL,_testing::Matcher<BasicTestExpr<1>_>_>.
          super__Head_base<1UL,_testing::Matcher<BasicTestExpr<1>_>,_false>._M_head_impl.
          super_MatcherBase<BasicTestExpr<1>_> + 0x10))->next_ =
       (linked_ptr_internal *)
       ((long)&(this->current_spec_).matchers_.
               super__Tuple_impl<0UL,_testing::Matcher<TestPLTermBuilder>,_testing::Matcher<BasicTestExpr<1>_>_>
               .super__Tuple_impl<1UL,_testing::Matcher<BasicTestExpr<1>_>_>.
               super__Head_base<1UL,_testing::Matcher<BasicTestExpr<1>_>,_false>._M_head_impl.
               super_MatcherBase<BasicTestExpr<1>_> + 0x10);
  (this->current_spec_).matchers_.
  super__Tuple_impl<0UL,_testing::Matcher<TestPLTermBuilder>,_testing::Matcher<BasicTestExpr<1>_>_>.
  super__Tuple_impl<1UL,_testing::Matcher<BasicTestExpr<1>_>_>.
  super__Head_base<1UL,_testing::Matcher<BasicTestExpr<1>_>,_false>._M_head_impl.
  super_MatcherBase<BasicTestExpr<1>_>._vptr_MatcherBase = (_func_int **)&PTR__MatcherBase_002b2b30;
  (this->current_spec_).matchers_.
  super__Tuple_impl<0UL,_testing::Matcher<TestPLTermBuilder>,_testing::Matcher<BasicTestExpr<1>_>_>.
  super__Head_base<0UL,_testing::Matcher<TestPLTermBuilder>,_false>._M_head_impl.
  super_MatcherBase<TestPLTermBuilder>.impl_.value_ = (MatcherInterface<TestPLTermBuilder> *)0x0;
  ((linked_ptr_internal *)
  ((long)&(this->current_spec_).matchers_.
          super__Tuple_impl<0UL,_testing::Matcher<TestPLTermBuilder>,_testing::Matcher<BasicTestExpr<1>_>_>
          .super__Head_base<0UL,_testing::Matcher<TestPLTermBuilder>,_false>._M_head_impl.
          super_MatcherBase<TestPLTermBuilder>.impl_ + 8))->next_ =
       (linked_ptr_internal *)
       ((long)&(this->current_spec_).matchers_.
               super__Tuple_impl<0UL,_testing::Matcher<TestPLTermBuilder>,_testing::Matcher<BasicTestExpr<1>_>_>
               .super__Head_base<0UL,_testing::Matcher<TestPLTermBuilder>,_false>._M_head_impl.
               super_MatcherBase<TestPLTermBuilder>.impl_ + 8);
  (this->current_spec_).matchers_.
  super__Tuple_impl<0UL,_testing::Matcher<TestPLTermBuilder>,_testing::Matcher<BasicTestExpr<1>_>_>.
  super__Head_base<0UL,_testing::Matcher<TestPLTermBuilder>,_false>._M_head_impl.
  super_MatcherBase<TestPLTermBuilder>._vptr_MatcherBase = (_func_int **)&PTR__MatcherBase_002b2c68;
  return;
}

Assistant:

FunctionMockerBase() : current_spec_(this) {}